

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-utils.cpp
# Opt level: O2

SortedVector *
wasm::ParamUtils::removeParameters
          (SortedVector *__return_storage_ptr__,
          vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *funcs,SortedVector *indexes,
          vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *calls,
          vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *callRefs,Module *module,
          PassRunner *runner)

{
  pointer ppFVar1;
  Function *this;
  Function *pFVar2;
  bool bVar3;
  const_iterator __begin2;
  pointer ppFVar4;
  size_t sVar5;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *__range2;
  Index x;
  
  if ((indexes->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (indexes->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
  }
  else {
    ppFVar4 = (funcs->super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    ppFVar1 = (funcs->super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar1 == ppFVar4) {
      __assert_fail("funcs.size() > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/param-utils.cpp"
                    ,0xb1,
                    "SortedVector wasm::ParamUtils::removeParameters(const std::vector<Function *> &, SortedVector, const std::vector<Call *> &, const std::vector<CallRef *> &, Module *, PassRunner *)"
                   );
    }
    this = *ppFVar4;
    while (ppFVar4 != ppFVar1) {
      pFVar2 = *ppFVar4;
      ppFVar4 = ppFVar4 + 1;
      if ((pFVar2->type).id != (this->type).id) {
        __assert_fail("func->type == first->type",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/param-utils.cpp"
                      ,0xb5,
                      "SortedVector wasm::ParamUtils::removeParameters(const std::vector<Function *> &, SortedVector, const std::vector<Call *> &, const std::vector<CallRef *> &, Module *, PassRunner *)"
                     );
      }
    }
    sVar5 = Function::getNumParams(this);
    (__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    x = (Index)sVar5;
    do {
      x = x - 1;
      bVar3 = SortedVector::has(indexes,x);
      if ((bVar3) && (bVar3 = removeParameter(funcs,x,calls,callRefs,module,runner), bVar3)) {
        SortedVector::insert(__return_storage_ptr__,x);
      }
    } while (x != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

SortedVector removeParameters(const std::vector<Function*>& funcs,
                              SortedVector indexes,
                              const std::vector<Call*>& calls,
                              const std::vector<CallRef*>& callRefs,
                              Module* module,
                              PassRunner* runner) {
  if (indexes.empty()) {
    return {};
  }

  assert(funcs.size() > 0);
  auto* first = funcs[0];
#ifndef NDEBUG
  for (auto* func : funcs) {
    assert(func->type == first->type);
  }
#endif

  // Iterate downwards, as we may remove more than one, and going forwards would
  // alter the indexes after us.
  Index i = first->getNumParams() - 1;
  SortedVector removed;
  while (1) {
    if (indexes.has(i)) {
      if (removeParameter(funcs, i, calls, callRefs, module, runner)) {
        // Success!
        removed.insert(i);
      }
    }
    if (i == 0) {
      break;
    }
    i--;
  }
  return removed;
}